

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O3

void __thiscall
CheckedSharedMutexTest_RecurseLockShared_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
::TestBody(CheckedSharedMutexTest_RecurseLockShared_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
           *this)

{
  bool *pbVar1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  StringLike<const_char_*> *regex;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var6;
  DeathTest *gtest_dt;
  TypeParam mtx;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_118;
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher> local_110;
  undefined8 uStack_f8;
  AssertHelper local_e8 [4];
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_c8;
  shared_mutex_base<yamc::rwlock::ReaderPrefer> local_b0;
  
  yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *)&local_b0);
  pbVar1 = &local_110.impl_.full_match_;
  local_110.impl_.full_match_ = false;
  local_110.impl_._17_7_ = 0;
  uStack_f8 = 0;
  local_110.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_110.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)pbVar1;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::lock_shared(&local_b0);
  }
  if (local_110.impl_.regex_.
      super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)pbVar1) {
    operator_delete(local_110.impl_.regex_.
                    super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_e8[0].data_ = (AssertHelperData *)0x1cec69;
    testing::ContainsRegex<char_const*>(&local_110,(testing *)local_e8,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_c8,(PolymorphicMatcher *)&local_110);
    if (local_110.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_110.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("mtx.lock_shared()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
                       ,0x124,(DeathTest **)&local_118);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_c8);
    _Var6._M_head_impl = local_118._M_head_impl;
    if (!bVar3) goto LAB_0018b906;
    if (local_118._M_head_impl ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0018b95c;
    iVar4 = (**(code **)(*(long *)local_118._M_head_impl + 0x10))(local_118._M_head_impl);
    _Var2._M_head_impl = local_118._M_head_impl;
    if (iVar4 == 0) {
      testing::KilledBySignal::KilledBySignal((KilledBySignal *)&local_110,6);
      iVar4 = (**(code **)(*(long *)&(local_118._M_head_impl)->field_0x0 + 0x18))();
      bVar3 = testing::KilledBySignal::operator()((KilledBySignal *)&local_110,iVar4);
      iVar4 = (**(code **)(*(long *)&(_Var2._M_head_impl)->field_0x0 + 0x20))
                        (_Var2._M_head_impl,(ulong)bVar3);
      if ((char)iVar4 == '\0') {
        (**(code **)(*(long *)_Var6._M_head_impl + 8))(_Var6._M_head_impl);
        goto LAB_0018b906;
      }
    }
    else if (iVar4 == 1) {
      bVar3 = testing::internal::AlwaysTrue();
      if (bVar3) {
        yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::lock_shared(&local_b0)
        ;
      }
      (**(code **)(*(long *)&(local_118._M_head_impl)->field_0x0 + 0x28))(local_118._M_head_impl,2);
      (**(code **)(*(long *)&(_Var2._M_head_impl)->field_0x0 + 0x28))(_Var2._M_head_impl,0);
    }
    pcVar5 = *(char **)_Var6._M_head_impl;
  }
  else {
LAB_0018b906:
    testing::Message::Message((Message *)&local_110);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0x124,pcVar5);
    testing::internal::AssertHelper::operator=(local_e8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(local_e8);
    if (local_110.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) goto LAB_0018b95c;
    pcVar5 = (local_110.impl_.regex_.
              super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             pattern_;
    _Var6._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         local_110.impl_.regex_.
         super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  (**(code **)(pcVar5 + 8))(_Var6._M_head_impl);
LAB_0018b95c:
  local_110.impl_.full_match_ = false;
  local_110.impl_._17_7_ = 0;
  uStack_f8 = 0;
  local_110.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_110.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)pbVar1;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::unlock_shared(&local_b0);
  }
  if (local_110.impl_.regex_.
      super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)pbVar1) {
    operator_delete(local_110.impl_.regex_.
                    super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  }
  yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::~basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *)&local_b0);
  return;
}

Assistant:

TYPED_TEST(CheckedSharedMutexTest, RecurseLockShared) {
  TypeParam mtx;
  ASSERT_NO_THROW(mtx.lock_shared());
  EXPECT_CHECK_FAILURE(mtx.lock_shared());
  ASSERT_NO_THROW(mtx.unlock_shared());
}